

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O1

void __thiscall nv::AlphaBlockDXT5::flip4(AlphaBlockDXT5 *this)

{
  ulong uVar1;
  
  uVar1 = (this->field_0).u;
  (this->field_0).u =
       uVar1 >> 0x24 & 0xfff0000 |
       uVar1 >> 0xc & 0xfff0000000 |
       (uVar1 & 0xfff0000000) << 0xc | (uVar1 & 0xfff0000) << 0x24 | uVar1 & 0xffff;
  return;
}

Assistant:

void AlphaBlockDXT5::flip4()
{
	uint64 * b = (uint64 *)this;
	
	// @@ The masks might have to be byte swapped.
	uint64 tmp = (*b & POSH_U64(0x000000000000FFFF));
	tmp |= (*b & POSH_U64(0x000000000FFF0000)) << 36;
	tmp |= (*b & POSH_U64(0x000000FFF0000000)) << 12;
	tmp |= (*b & POSH_U64(0x000FFF0000000000)) >> 12;
	tmp |= (*b & POSH_U64(0xFFF0000000000000)) >> 36;
	
	*b = tmp;
}